

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_tests.cpp
# Opt level: O1

void __thiscall bloom_tests::merkle_block_1::test_method(merkle_block_1 *this)

{
  pointer puVar1;
  uint256 *puVar2;
  uchar *puVar3;
  undefined8 uVar4;
  bool bVar5;
  pointer puVar6;
  pointer ppVar7;
  pointer ppVar8;
  int iVar9;
  long lVar10;
  undefined8 *puVar11;
  CMerkleBlock *pCVar12;
  iterator in_R8;
  iterator pvVar13;
  iterator in_R9;
  iterator pvVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  long in_FS_OFFSET;
  readonly_property<bool> rVar18;
  byte bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  Span<const_unsigned_char> vKey;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  Span<const_unsigned_char> vKey_00;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  CBloomFilter filter;
  pair<unsigned_int,_uint256> pair;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vIndex;
  vector<uint256,_std::allocator<uint256>_> vMatched;
  CBlock block;
  char *pcVar36;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  string *local_358;
  string *local_350;
  char *local_348;
  char *local_340;
  assertion_result local_338;
  CBloomFilter local_320;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [9];
  uchar uStack_2df;
  uchar uStack_2de;
  uchar uStack_2dd;
  uchar uStack_2dc;
  uchar uStack_2db;
  uchar uStack_2da;
  uchar uStack_2d9;
  uint local_2a8;
  _Bit_type *local_2a0;
  uint uStack_298;
  undefined4 uStack_294;
  _Bit_type *local_290;
  uint uStack_288;
  undefined4 uStack_284;
  _Bit_pointer local_280;
  undefined1 local_278 [16];
  pointer local_268;
  bool local_260;
  undefined1 local_258 [16];
  pointer local_248;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined4 local_218;
  undefined1 local_208 [8];
  shared_ptr<boost::basic_wrap_stringstream<char>_> local_200;
  string local_1e8;
  undefined1 local_1c8 [16];
  pointer local_1b8;
  undefined1 local_1a8 [16];
  undefined1 *apuStack_198 [2];
  undefined1 local_188 [8];
  shared_ptr<boost::basic_wrap_stringstream<char>_> sStack_180;
  undefined8 uStack_170;
  CMerkleBlock local_168;
  CBlock local_a8;
  long local_38;
  
  local_200.pn.pi_ = (sp_counted_base *)local_200.px;
  bVar19 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  getBlock13b8a();
  CBloomFilter::CBloomFilter(&local_320,10,1e-06,0,'\x01');
  local_168.header.nVersion = -0x78bae0e0;
  local_168.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = 0xec;
  local_168.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = 0x86;
  local_168.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = 0xb5;
  local_168.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = 0x82;
  local_168.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = 0x97;
  local_168.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = 0xed;
  local_168.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = 0xc2;
  local_168.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = 0xdd;
  local_168.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '2';
  local_168.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = 0xd6;
  local_168.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = 0xfc;
  local_168.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = 0xd9;
  local_168.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = 0x98;
  local_168.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = 0xaa;
  local_168.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = 'y';
  local_168.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = 'C';
  local_168.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\b';
  local_168.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = 0xaa;
  local_168.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = 200;
  local_168.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\x02';
  local_168.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = 0xa8;
  local_168.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = 0xaf;
  local_168.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = ';';
  local_168.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = 0xe0;
  local_168.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = 0xe0;
  local_168.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = 0x81;
  local_168.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = 0xd6;
  local_168.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = 't';
  vKey.m_size = 0x20;
  vKey.m_data = (uchar *)&local_168;
  CBloomFilter::insert(&local_320,vKey);
  CMerkleBlock::CMerkleBlock
            (&local_168,&local_a8,&local_320,
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)0x0);
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xb5;
  file.m_begin = (iterator)&local_368;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_378,msg);
  sStack_180.px = (element_type *)(sStack_180._1_8_ << 8);
  local_188 = (undefined1  [8])&PTR__lazy_ostream_013abb30;
  sStack_180.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  uStack_170 = (assertion_result *)0xf6cf21;
  CBlockHeader::GetHash((uint256 *)local_1c8,&local_168.header);
  base_blob<256u>::GetHex_abi_cxx11_((string *)local_1a8,local_1c8);
  CBlockHeader::GetHash((uint256 *)local_208,&local_a8.super_CBlockHeader);
  base_blob<256u>::GetHex_abi_cxx11_(&local_1e8,local_208);
  if (local_1a8._8_8_ == local_1e8._M_string_length) {
    if ((element_type *)local_1a8._8_8_ == (element_type *)0x0) {
      rVar18.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar9 = bcmp((void *)local_1a8._0_8_,local_1e8._M_dataplus._M_p,local_1a8._8_8_);
      rVar18.super_class_property<bool>.value = (class_property<bool>)(iVar9 == 0);
    }
  }
  else {
    rVar18.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_338.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar18.super_class_property<bool>.value;
  local_338.m_message.px = (element_type *)0x0;
  local_338.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_340 = "";
  local_2f8[8] = 0;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abbf0;
  stack0xfffffffffffffd20 = (lazy_ostream *)&local_350;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  uStack_220 = &local_358;
  uStack_230 = uStack_230 & 0xffffffffffffff00;
  local_238 = &PTR__lazy_ostream_013abbf0;
  local_228 = boost::unit_test::lazy_ostream::inst;
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x2;
  local_358 = &local_1e8;
  local_350 = (string *)local_1a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_338,(lazy_ostream *)local_188,1,2,REQUIRE,0xe696bf,(size_t)&local_348,0xb5,
             local_2f8,"block.GetHash().GetHex()",&local_238);
  boost::detail::shared_count::~shared_count(&local_338.m_message.pn);
  if (local_1e8._M_dataplus._M_p != (pointer)((long)&local_1e8 + 0x10)) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)apuStack_198) {
    operator_delete((void *)local_1a8._0_8_,(long)apuStack_198[0] + 1);
  }
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xb7;
  file_00.m_begin = (iterator)&local_388;
  msg_00.m_end = pvVar14;
  msg_00.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_398,
             msg_00);
  sStack_180.px = (element_type *)(sStack_180._1_8_ << 8);
  local_188 = (undefined1  [8])&PTR__lazy_ostream_013abb30;
  sStack_180.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  uStack_170 = (assertion_result *)0xf6cf21;
  local_338._0_8_ =
       ((long)local_168.vMatchedTxn.
              super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_168.vMatchedTxn.
              super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x71c71c71c71c71c7;
  local_348 = (char *)CONCAT44(local_348._4_4_,1);
  local_1a8._8_8_ = (element_type *)0x0;
  apuStack_198[0] = (undefined1 *)0x0;
  local_1c8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_1c8._8_8_ = "";
  local_1e8._M_dataplus._M_p = (pointer)&local_338;
  local_2f8[8] = 0;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abb70;
  stack0xfffffffffffffd20 = (lazy_ostream *)&local_1e8;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  uStack_230 = uStack_230 & 0xffffffffffffff00;
  local_238 = &PTR__lazy_ostream_013abbb0;
  local_228 = boost::unit_test::lazy_ostream::inst;
  pcVar36 = "merkleBlock.vMatchedTxn.size()";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x2;
  uStack_220 = (string **)local_208;
  local_208 = (undefined1  [8])&local_348;
  local_1a8[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((long)local_168.vMatchedTxn.
                        super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_168.vMatchedTxn.
                        super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                        ._M_impl.super__Vector_impl_data._M_start == 0x24);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a8,(lazy_ostream *)local_188,1,2,REQUIRE,0xe697f1,
             (size_t)local_1c8,0xb7,local_2f8,"1U",&local_238);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)apuStack_198)->_M_allocated_capacity);
  local_238._0_4_ =
       (local_168.vMatchedTxn.
        super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->first;
  local_238._4_1_ =
       ((local_168.vMatchedTxn.
         super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data._M_elems
       [0];
  local_238._5_1_ =
       ((local_168.vMatchedTxn.
         super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data._M_elems
       [1];
  local_238._6_1_ =
       ((local_168.vMatchedTxn.
         super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data._M_elems
       [2];
  local_238._7_1_ =
       ((local_168.vMatchedTxn.
         super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data._M_elems
       [3];
  uStack_230 = *(ulong *)(((local_168.vMatchedTxn.
                            super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->second).
                          super_base_blob<256U>.m_data._M_elems + 4);
  local_228 = *(undefined1 **)
               (((local_168.vMatchedTxn.
                  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                _M_elems + 0xc);
  uStack_220 = *(string ***)
                (((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems + 0x14);
  local_218 = *(undefined4 *)
               (((local_168.vMatchedTxn.
                  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                _M_elems + 0x1c);
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xba;
  file_01.m_begin = (iterator)&local_3a8;
  msg_01.m_end = pvVar14;
  msg_01.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_3b8,
             msg_01);
  local_2f8._0_8_ = _DAT_00e690d0;
  local_2f8[8] = UNK_00e690d8;
  local_2f8._9_7_ = _UNK_00e690d9;
  _local_2e8 = _DAT_00e690e0;
  auVar25[0] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[0x10] == DAT_00e690e0);
  auVar25[1] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[0x11] == DAT_00e690e0._1_1_);
  auVar25[2] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[0x12] == DAT_00e690e0._2_1_);
  auVar25[3] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[0x13] == DAT_00e690e0._3_1_);
  auVar25[4] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[0x14] == DAT_00e690e0._4_1_);
  auVar25[5] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[0x15] == DAT_00e690e0._5_1_);
  auVar25[6] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[0x16] == DAT_00e690e0._6_1_);
  auVar25[7] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[0x17] == DAT_00e690e0._7_1_);
  auVar25[8] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[0x18] == DAT_00e690e0._8_1_);
  auVar25[9] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[0x19] == DAT_00e690e0._9_1_);
  auVar25[10] = -(((local_168.vMatchedTxn.
                    super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data
                  ._M_elems[0x1a] == DAT_00e690e0._10_1_);
  auVar25[0xb] = -(((local_168.vMatchedTxn.
                     super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.
                   m_data._M_elems[0x1b] == DAT_00e690e0._11_1_);
  auVar25[0xc] = -(((local_168.vMatchedTxn.
                     super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.
                   m_data._M_elems[0x1c] == DAT_00e690e0._12_1_);
  auVar25[0xd] = -(((local_168.vMatchedTxn.
                     super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.
                   m_data._M_elems[0x1d] == DAT_00e690e0._13_1_);
  auVar25[0xe] = -(((local_168.vMatchedTxn.
                     super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.
                   m_data._M_elems[0x1e] == DAT_00e690e0._14_1_);
  auVar25[0xf] = -(((local_168.vMatchedTxn.
                     super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.
                   m_data._M_elems[0x1f] == DAT_00e690e0._15_1_);
  auVar20[0] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[0] == DAT_00e690d0);
  auVar20[1] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[1] == DAT_00e690d0._1_1_);
  auVar20[2] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[2] == DAT_00e690d0._2_1_);
  auVar20[3] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[3] == DAT_00e690d0._3_1_);
  auVar20[4] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[4] == DAT_00e690d0._4_1_);
  auVar20[5] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[5] == DAT_00e690d0._5_1_);
  auVar20[6] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[6] == DAT_00e690d0._6_1_);
  auVar20[7] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[7] == DAT_00e690d0._7_1_);
  auVar20[8] = -((bool)((local_168.vMatchedTxn.
                         super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.
                       m_data._M_elems[8] == DAT_00e690d0._8_1_);
  auVar20[9] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[9] == DAT_00e690d0._9_1_);
  auVar20[10] = -(((local_168.vMatchedTxn.
                    super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data
                  ._M_elems[10] == DAT_00e690d0._10_1_);
  auVar20[0xb] = -(((local_168.vMatchedTxn.
                     super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.
                   m_data._M_elems[0xb] == DAT_00e690d0._11_1_);
  auVar20[0xc] = -(((local_168.vMatchedTxn.
                     super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.
                   m_data._M_elems[0xc] == DAT_00e690d0._12_1_);
  auVar20[0xd] = -(((local_168.vMatchedTxn.
                     super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.
                   m_data._M_elems[0xd] == DAT_00e690d0._13_1_);
  auVar20[0xe] = -(((local_168.vMatchedTxn.
                     super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.
                   m_data._M_elems[0xe] == DAT_00e690d0._14_1_);
  auVar20[0xf] = -(((local_168.vMatchedTxn.
                     super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.
                   m_data._M_elems[0xf] == DAT_00e690d0._15_1_);
  auVar20 = auVar20 & auVar25;
  local_1a8[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff);
  local_1a8._8_8_ = (element_type *)0x0;
  apuStack_198[0] = (undefined1 *)0x0;
  local_1c8._8_8_ = "";
  local_1c8._0_8_ =
       "merkleBlock.vMatchedTxn[0].second == uint256{\"74d681e0e03bafa802c8aa084379aa98d9fcd632ddc2ed9782b586ec87451f20\"}"
  ;
  sStack_180.px = (element_type *)(sStack_180._1_8_ << 8);
  local_188 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  sStack_180.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_3c0 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  uStack_170 = (assertion_result *)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a8,(lazy_ostream *)local_188,1,0,WARN,(check_type)pcVar36,
             (size_t)&local_3c8,0xba);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)apuStack_198)->_M_allocated_capacity);
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xbb;
  file_02.m_begin = (iterator)&local_3d8;
  msg_02.m_end = pvVar14;
  msg_02.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3e8,
             msg_02);
  local_188[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first == 8);
  sStack_180.px = (element_type *)0x0;
  sStack_180.pn.pi_ = (sp_counted_base *)0x0;
  local_1a8._0_8_ = "merkleBlock.vMatchedTxn[0].first == 8";
  local_1a8._8_8_ = (element_type *)0xe69794;
  local_2f8[8] = 0;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abc70;
  stack0xfffffffffffffd20 = (lazy_ostream *)local_1a8;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_3f0 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_188,(lazy_ostream *)local_2f8,1,0,WARN,(check_type)pcVar36,
             (size_t)&local_3f8,0xbb);
  boost::detail::shared_count::~shared_count(&sStack_180.pn);
  local_1b8 = (pointer)0x0;
  local_1c8 = (undefined1  [16])0x0;
  local_1e8.field_2._M_allocated_capacity = 0;
  local_1e8._M_dataplus._M_p = (pointer)0x0;
  local_1e8._M_string_length = 0;
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xbf;
  file_03.m_begin = (iterator)&local_408;
  msg_03.m_end = pvVar14;
  msg_03.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_418,
             msg_03);
  CPartialMerkleTree::ExtractMatches
            ((uint256 *)local_2f8,&local_168.txn,
             (vector<uint256,_std::allocator<uint256>_> *)local_1c8,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1e8);
  auVar26[0] = -((class_property<bool>)
                 local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0]
                == local_2f8[0]);
  auVar26[1] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1]
                == local_2f8[1]);
  auVar26[2] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2]
                == local_2f8[2]);
  auVar26[3] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3]
                == local_2f8[3]);
  auVar26[4] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4]
                == local_2f8[4]);
  auVar26[5] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5]
                == local_2f8[5]);
  auVar26[6] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6]
                == local_2f8[6]);
  auVar26[7] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7]
                == local_2f8[7]);
  auVar26[8] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8]
                == local_2f8[8]);
  auVar26[9] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9]
                == local_2f8[9]);
  auVar26[10] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [10] == local_2f8[10]);
  auVar26[0xb] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0xb] == local_2f8[0xb]);
  auVar26[0xc] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0xc] == local_2f8[0xc]);
  auVar26[0xd] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0xd] == local_2f8[0xd]);
  auVar26[0xe] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0xe] == local_2f8[0xe]);
  auVar26[0xf] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0xf] == local_2f8[0xf]);
  auVar30[0] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                 [0x10] == local_2e8[0]);
  auVar30[1] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                 [0x11] == local_2e8[1]);
  auVar30[2] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                 [0x12] == local_2e8[2]);
  auVar30[3] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                 [0x13] == local_2e8[3]);
  auVar30[4] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                 [0x14] == local_2e8[4]);
  auVar30[5] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                 [0x15] == local_2e8[5]);
  auVar30[6] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                 [0x16] == local_2e8[6]);
  auVar30[7] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                 [0x17] == local_2e8[7]);
  auVar30[8] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                 [0x18] == local_2e8[8]);
  auVar30[9] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                 [0x19] == uStack_2df);
  auVar30[10] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x1a] == uStack_2de);
  auVar30[0xb] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0x1b] == uStack_2dd);
  auVar30[0xc] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0x1c] == uStack_2dc);
  auVar30[0xd] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0x1d] == uStack_2db);
  auVar30[0xe] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0x1e] == uStack_2da);
  auVar30[0xf] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0x1f] == uStack_2d9);
  auVar26 = auVar26 & auVar30;
  local_1a8[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar26[0xf] >> 7) << 0xf) == 0xffff);
  local_1a8._8_8_ = (element_type *)0x0;
  apuStack_198[0] = (undefined1 *)0x0;
  local_208 = (undefined1  [8])0xe69795;
  local_200.px = (element_type *)0xe697dd;
  sStack_180.px = (element_type *)(sStack_180._1_8_ << 8);
  local_188 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  sStack_180.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_420 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  uStack_170 = (assertion_result *)local_208;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a8,(lazy_ostream *)local_188,1,0,WARN,(check_type)pcVar36,
             (size_t)&local_428,0xbf);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)apuStack_198)->_M_allocated_capacity);
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xc0;
  file_04.m_begin = (iterator)&local_438;
  msg_04.m_end = pvVar14;
  msg_04.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_448,
             msg_04);
  local_188[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((long)(local_1c8._8_8_ - local_1c8._0_8_) >> 5 ==
                 ((long)local_168.vMatchedTxn.
                        super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_168.vMatchedTxn.
                        super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x71c71c71c71c71c7);
  sStack_180.px = (element_type *)0x0;
  sStack_180.pn.pi_ = (sp_counted_base *)0x0;
  local_1a8._0_8_ = "vMatched.size() == merkleBlock.vMatchedTxn.size()";
  local_1a8._8_8_ = (element_type *)0xe6980f;
  local_2f8[8] = 0;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abc70;
  unique0x00005300 = (lazy_ostream *)local_1a8;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_450 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_188,(lazy_ostream *)local_2f8,1,0,WARN,(check_type)pcVar36,
             (size_t)&local_458,0xc0);
  boost::detail::shared_count::~shared_count(&sStack_180.pn);
  if (local_1c8._8_8_ != local_1c8._0_8_) {
    uVar15 = 0;
    uVar17 = 1;
    do {
      local_468 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
      ;
      local_460 = "";
      local_478 = &boost::unit_test::basic_cstring<char_const>::null;
      local_470 = &boost::unit_test::basic_cstring<char_const>::null;
      file_05.m_end = (iterator)0xc2;
      file_05.m_begin = (iterator)&local_468;
      msg_05.m_end = pvVar14;
      msg_05.m_begin = pvVar13;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_478,
                 msg_05);
      puVar1 = (pointer)(local_1c8._0_8_ + uVar15 * 0x20);
      auVar20 = *(undefined1 (*) [16])
                 ((((pointer)(local_1c8._0_8_ + uVar15 * 0x20))->super_base_blob<256U>).m_data.
                  _M_elems + 0x10);
      puVar2 = &local_168.vMatchedTxn.
                super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar15].second;
      auVar31[0] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[0]);
      auVar31[1] = -((puVar2->super_base_blob<256U>).m_data._M_elems[1] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[1]);
      auVar31[2] = -((puVar2->super_base_blob<256U>).m_data._M_elems[2] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[2]);
      auVar31[3] = -((puVar2->super_base_blob<256U>).m_data._M_elems[3] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[3]);
      auVar31[4] = -((puVar2->super_base_blob<256U>).m_data._M_elems[4] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[4]);
      auVar31[5] = -((puVar2->super_base_blob<256U>).m_data._M_elems[5] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[5]);
      auVar31[6] = -((puVar2->super_base_blob<256U>).m_data._M_elems[6] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[6]);
      auVar31[7] = -((puVar2->super_base_blob<256U>).m_data._M_elems[7] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[7]);
      auVar31[8] = -((puVar2->super_base_blob<256U>).m_data._M_elems[8] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[8]);
      auVar31[9] = -((puVar2->super_base_blob<256U>).m_data._M_elems[9] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[9]);
      auVar31[10] = -((puVar2->super_base_blob<256U>).m_data._M_elems[10] ==
                     (puVar1->super_base_blob<256U>).m_data._M_elems[10]);
      auVar31[0xb] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xb] ==
                      (puVar1->super_base_blob<256U>).m_data._M_elems[0xb]);
      auVar31[0xc] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xc] ==
                      (puVar1->super_base_blob<256U>).m_data._M_elems[0xc]);
      auVar31[0xd] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xd] ==
                      (puVar1->super_base_blob<256U>).m_data._M_elems[0xd]);
      auVar31[0xe] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xe] ==
                      (puVar1->super_base_blob<256U>).m_data._M_elems[0xe]);
      auVar31[0xf] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xf] ==
                      (puVar1->super_base_blob<256U>).m_data._M_elems[0xf]);
      puVar3 = local_168.vMatchedTxn.
               super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15].second.super_base_blob<256U>.m_data
               ._M_elems + 0x10;
      auVar21[0] = -(*puVar3 == auVar20[0]);
      auVar21[1] = -(puVar3[1] == auVar20[1]);
      auVar21[2] = -(puVar3[2] == auVar20[2]);
      auVar21[3] = -(puVar3[3] == auVar20[3]);
      auVar21[4] = -(puVar3[4] == auVar20[4]);
      auVar21[5] = -(puVar3[5] == auVar20[5]);
      auVar21[6] = -(puVar3[6] == auVar20[6]);
      auVar21[7] = -(puVar3[7] == auVar20[7]);
      auVar21[8] = -(puVar3[8] == auVar20[8]);
      auVar21[9] = -(puVar3[9] == auVar20[9]);
      auVar21[10] = -(puVar3[10] == auVar20[10]);
      auVar21[0xb] = -(puVar3[0xb] == auVar20[0xb]);
      auVar21[0xc] = -(puVar3[0xc] == auVar20[0xc]);
      auVar21[0xd] = -(puVar3[0xd] == auVar20[0xd]);
      auVar21[0xe] = -(puVar3[0xe] == auVar20[0xe]);
      auVar21[0xf] = -(puVar3[0xf] == auVar20[0xf]);
      auVar21 = auVar21 & auVar31;
      local_188[0] = (class_property<bool>)
                     (class_property<bool>)
                     ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) == 0xffff);
      sStack_180.px = (element_type *)0x0;
      sStack_180.pn.pi_ = (sp_counted_base *)0x0;
      local_1a8._0_8_ = "vMatched[i] == merkleBlock.vMatchedTxn[i].second";
      local_1a8._8_8_ = (element_type *)0xe69840;
      local_2f8[8] = 0;
      local_2f8._0_8_ = &PTR__lazy_ostream_013abc70;
      unique0x00005300 = (lazy_ostream *)local_1a8;
      local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
      local_488 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
      ;
      local_480 = "";
      pvVar13 = (iterator)0x1;
      pvVar14 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_188,(lazy_ostream *)local_2f8,1,0,WARN,
                 (check_type)pcVar36,(size_t)&local_488,0xc2);
      boost::detail::shared_count::~shared_count(&sStack_180.pn);
      bVar5 = uVar17 < (ulong)((long)(local_1c8._8_8_ - local_1c8._0_8_) >> 5);
      uVar15 = uVar17;
      uVar17 = (ulong)((int)uVar17 + 1);
    } while (bVar5);
  }
  local_2f8._8_8_ = 0x7f4f728691ac62e8;
  local_2f8._0_8_ = (_func_int **)0xf168809cdfae1053;
  stack0xfffffffffffffd20 = (lazy_ostream *)0xdd1fd2a6fc16404f;
  local_2e8._0_8_ = 0xaf339881a90adbde;
  vKey_00.m_size = 0x20;
  vKey_00.m_data = local_2f8;
  CBloomFilter::insert(&local_320,vKey_00);
  CMerkleBlock::CMerkleBlock
            ((CMerkleBlock *)local_2f8,&local_a8,&local_320,
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)0x0);
  puVar11 = (undefined8 *)local_2f8;
  pCVar12 = &local_168;
  for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
    uVar4 = *puVar11;
    (pCVar12->header).nVersion = (int)uVar4;
    (pCVar12->header).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] =
         (char)((ulong)uVar4 >> 0x20);
    (pCVar12->header).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] =
         (char)((ulong)uVar4 >> 0x28);
    (pCVar12->header).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] =
         (char)((ulong)uVar4 >> 0x30);
    (pCVar12->header).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] =
         (char)((ulong)uVar4 >> 0x38);
    puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
    pCVar12 = (CMerkleBlock *)((long)pCVar12 + ((ulong)bVar19 * -2 + 1) * 8);
  }
  local_168.txn.nTransactions = local_2a8;
  if (local_168.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_168.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_168.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_168.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  puVar6 = local_168.txn.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  puVar1 = local_168.txn.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_168.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = local_280;
  local_168.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._8_8_ = CONCAT44(uStack_294,uStack_298);
  local_168.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._8_8_ = CONCAT44(uStack_284,uStack_288);
  local_168.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = local_290;
  local_168.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = local_2a0;
  local_2a0 = (_Bit_type *)0x0;
  uStack_298 = 0;
  local_290 = (_Bit_type *)0x0;
  uStack_288 = 0;
  local_280 = (_Bit_pointer)0x0;
  local_168.txn.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_278._0_8_;
  local_168.txn.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_278._8_8_;
  local_168.txn.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_268;
  local_278 = (undefined1  [16])0x0;
  local_268 = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)puVar6 - (long)puVar1);
  }
  ppVar8 = local_168.vMatchedTxn.
           super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ppVar7 = local_168.vMatchedTxn.
           super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_168.txn.fBad = local_260;
  local_168.vMatchedTxn.
  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_258._0_8_;
  local_168.vMatchedTxn.
  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_258._8_8_;
  local_168.vMatchedTxn.
  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_248;
  local_258 = (undefined1  [16])0x0;
  local_248 = (pointer)0x0;
  if (ppVar7 != (pointer)0x0) {
    operator_delete(ppVar7,(long)ppVar8 - (long)ppVar7);
  }
  if ((pointer)local_258._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_258._0_8_,(long)local_248 - local_258._0_8_);
  }
  if ((pointer)local_278._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_278._0_8_,(long)local_268 - local_278._0_8_);
  }
  if (local_2a0 != (_Bit_type *)0x0) {
    operator_delete(local_2a0,(long)local_280 - (long)local_2a0);
    local_2a0 = (_Bit_type *)0x0;
    uStack_298 = 0;
    local_290 = (_Bit_type *)0x0;
    uStack_288 = 0;
    local_280 = (_Bit_pointer)0x0;
  }
  local_498 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_490 = "";
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xc7;
  file_06.m_begin = (iterator)&local_498;
  msg_06.m_end = pvVar14;
  msg_06.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_4a8,
             msg_06);
  CBlockHeader::GetHash((uint256 *)local_2f8,&local_168.header);
  CBlockHeader::GetHash((uint256 *)local_188,&local_a8.super_CBlockHeader);
  auVar27[0] = -(local_188[0] == local_2f8[0]);
  auVar27[1] = -(local_188[1] == local_2f8[1]);
  auVar27[2] = -(local_188[2] == local_2f8[2]);
  auVar27[3] = -(local_188[3] == local_2f8[3]);
  auVar27[4] = -(local_188[4] == local_2f8[4]);
  auVar27[5] = -(local_188[5] == local_2f8[5]);
  auVar27[6] = -(local_188[6] == local_2f8[6]);
  auVar27[7] = -(local_188[7] == local_2f8[7]);
  auVar27[8] = -(sStack_180.px._0_1_ == (bool)local_2f8[8]);
  auVar27[9] = -(sStack_180.px._1_1_ == local_2f8[9]);
  auVar27[10] = -(sStack_180.px._2_1_ == local_2f8[10]);
  auVar27[0xb] = -(sStack_180.px._3_1_ == local_2f8[0xb]);
  auVar27[0xc] = -(sStack_180.px._4_1_ == local_2f8[0xc]);
  auVar27[0xd] = -(sStack_180.px._5_1_ == local_2f8[0xd]);
  auVar27[0xe] = -(sStack_180.px._6_1_ == local_2f8[0xe]);
  auVar27[0xf] = -(sStack_180.px._7_1_ == local_2f8[0xf]);
  auVar32[0] = -((uchar)sStack_180.pn.pi_ == local_2e8[0]);
  auVar32[1] = -(sStack_180.pn.pi_._1_1_ == local_2e8[1]);
  auVar32[2] = -(sStack_180.pn.pi_._2_1_ == local_2e8[2]);
  auVar32[3] = -(sStack_180.pn.pi_._3_1_ == local_2e8[3]);
  auVar32[4] = -(sStack_180.pn.pi_._4_1_ == local_2e8[4]);
  auVar32[5] = -(sStack_180.pn.pi_._5_1_ == local_2e8[5]);
  auVar32[6] = -(sStack_180.pn.pi_._6_1_ == local_2e8[6]);
  auVar32[7] = -(sStack_180.pn.pi_._7_1_ == local_2e8[7]);
  auVar32[8] = -((uchar)uStack_170 == local_2e8[8]);
  auVar32[9] = -(uStack_170._1_1_ == uStack_2df);
  auVar32[10] = -(uStack_170._2_1_ == uStack_2de);
  auVar32[0xb] = -(uStack_170._3_1_ == uStack_2dd);
  auVar32[0xc] = -(uStack_170._4_1_ == uStack_2dc);
  auVar32[0xd] = -(uStack_170._5_1_ == uStack_2db);
  auVar32[0xe] = -(uStack_170._6_1_ == uStack_2da);
  auVar32[0xf] = -(uStack_170._7_1_ == uStack_2d9);
  auVar27 = auVar27 & auVar32;
  local_208[0] = (ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) == 0xffff;
  local_200.px = (element_type *)0x0;
  local_200.pn.pi_ = (sp_counted_base *)0x0;
  local_338._0_8_ = "merkleBlock.header.GetHash() == block.GetHash()";
  local_338.m_message.px = (element_type *)0xe69870;
  local_1a8._8_8_ = local_1a8._9_8_ << 8;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abc70;
  apuStack_198[0] = boost::unit_test::lazy_ostream::inst;
  apuStack_198[1] =
       &local_338.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value;
  local_4b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_4b0 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_208,(lazy_ostream *)local_1a8,1,0,WARN,(check_type)pcVar36,
             (size_t)&local_4b8,199);
  boost::detail::shared_count::~shared_count(&local_200.pn);
  local_4c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_4c0 = "";
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0xc9;
  file_07.m_begin = (iterator)&local_4c8;
  msg_07.m_end = pvVar14;
  msg_07.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_4d8,
             msg_07);
  sStack_180.px = (element_type *)0x0;
  sStack_180.pn.pi_ = (sp_counted_base *)0x0;
  local_1a8._0_8_ = "merkleBlock.vMatchedTxn.size() == 2";
  local_1a8._8_8_ = "";
  local_2f8[8] = 0;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abc70;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_4e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_4e0 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  local_188[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((long)local_168.vMatchedTxn.
                        super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_168.vMatchedTxn.
                        super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                        ._M_impl.super__Vector_impl_data._M_start == 0x48);
  unique0x10004b72 = (lazy_ostream *)local_1a8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_188,(lazy_ostream *)local_2f8,1,0,WARN,(check_type)pcVar36,
             (size_t)&local_4e8,0xc9);
  boost::detail::shared_count::~shared_count(&sStack_180.pn);
  local_4f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_4f0 = "";
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0xcb;
  file_08.m_begin = (iterator)&local_4f8;
  msg_08.m_end = pvVar14;
  msg_08.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_508,
             msg_08);
  if (local_168.vMatchedTxn.
      super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
      ._M_impl.super__Vector_impl_data._M_start[1].first == (uint)local_238) {
    auVar33[0] = -(local_238._4_1_ ==
                  local_168.vMatchedTxn.
                  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data.
                  _M_elems[0]);
    auVar33[1] = -(local_238._5_1_ ==
                  local_168.vMatchedTxn.
                  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data.
                  _M_elems[1]);
    auVar33[2] = -(local_238._6_1_ ==
                  local_168.vMatchedTxn.
                  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data.
                  _M_elems[2]);
    auVar33[3] = -(local_238._7_1_ ==
                  local_168.vMatchedTxn.
                  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data.
                  _M_elems[3]);
    auVar33[4] = -((uchar)uStack_230 ==
                  local_168.vMatchedTxn.
                  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data.
                  _M_elems[4]);
    auVar33[5] = -(uStack_230._1_1_ ==
                  local_168.vMatchedTxn.
                  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data.
                  _M_elems[5]);
    auVar33[6] = -(uStack_230._2_1_ ==
                  local_168.vMatchedTxn.
                  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data.
                  _M_elems[6]);
    auVar33[7] = -(uStack_230._3_1_ ==
                  local_168.vMatchedTxn.
                  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data.
                  _M_elems[7]);
    auVar33[8] = -(uStack_230._4_1_ ==
                  local_168.vMatchedTxn.
                  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data.
                  _M_elems[8]);
    auVar33[9] = -(uStack_230._5_1_ ==
                  local_168.vMatchedTxn.
                  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data.
                  _M_elems[9]);
    auVar33[10] = -(uStack_230._6_1_ ==
                   local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data.
                   _M_elems[10]);
    auVar33[0xb] = -(uStack_230._7_1_ ==
                    local_168.vMatchedTxn.
                    super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data
                    ._M_elems[0xb]);
    auVar33[0xc] = -((uchar)local_228 ==
                    local_168.vMatchedTxn.
                    super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data
                    ._M_elems[0xc]);
    auVar33[0xd] = -(local_228._1_1_ ==
                    local_168.vMatchedTxn.
                    super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data
                    ._M_elems[0xd]);
    auVar33[0xe] = -(local_228._2_1_ ==
                    local_168.vMatchedTxn.
                    super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data
                    ._M_elems[0xe]);
    auVar33[0xf] = -(local_228._3_1_ ==
                    local_168.vMatchedTxn.
                    super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data
                    ._M_elems[0xf]);
    auVar22[0] = -(local_228._4_1_ ==
                  local_168.vMatchedTxn.
                  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data.
                  _M_elems[0x10]);
    auVar22[1] = -(local_228._5_1_ ==
                  local_168.vMatchedTxn.
                  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data.
                  _M_elems[0x11]);
    auVar22[2] = -(local_228._6_1_ ==
                  local_168.vMatchedTxn.
                  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data.
                  _M_elems[0x12]);
    auVar22[3] = -(local_228._7_1_ ==
                  local_168.vMatchedTxn.
                  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data.
                  _M_elems[0x13]);
    auVar22[4] = -((uchar)uStack_220 ==
                  local_168.vMatchedTxn.
                  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data.
                  _M_elems[0x14]);
    auVar22[5] = -(uStack_220._1_1_ ==
                  local_168.vMatchedTxn.
                  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data.
                  _M_elems[0x15]);
    auVar22[6] = -(uStack_220._2_1_ ==
                  local_168.vMatchedTxn.
                  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data.
                  _M_elems[0x16]);
    auVar22[7] = -(uStack_220._3_1_ ==
                  local_168.vMatchedTxn.
                  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data.
                  _M_elems[0x17]);
    auVar22[8] = -(uStack_220._4_1_ ==
                  local_168.vMatchedTxn.
                  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data.
                  _M_elems[0x18]);
    auVar22[9] = -(uStack_220._5_1_ ==
                  local_168.vMatchedTxn.
                  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data.
                  _M_elems[0x19]);
    auVar22[10] = -(uStack_220._6_1_ ==
                   local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data.
                   _M_elems[0x1a]);
    auVar22[0xb] = -(uStack_220._7_1_ ==
                    local_168.vMatchedTxn.
                    super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data
                    ._M_elems[0x1b]);
    auVar22[0xc] = -((uchar)local_218 ==
                    local_168.vMatchedTxn.
                    super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data
                    ._M_elems[0x1c]);
    auVar22[0xd] = -(local_218._1_1_ ==
                    local_168.vMatchedTxn.
                    super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data
                    ._M_elems[0x1d]);
    auVar22[0xe] = -(local_218._2_1_ ==
                    local_168.vMatchedTxn.
                    super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data
                    ._M_elems[0x1e]);
    auVar22[0xf] = -(local_218._3_1_ ==
                    local_168.vMatchedTxn.
                    super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>.m_data
                    ._M_elems[0x1f]);
    auVar22 = auVar22 & auVar33;
    local_188[0] = (class_property<bool>)
                   ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) == 0xffff);
  }
  else {
    local_188[0] = (class_property<bool>)false;
  }
  sStack_180.px = (element_type *)0x0;
  sStack_180.pn.pi_ = (sp_counted_base *)0x0;
  local_1a8._0_8_ = "merkleBlock.vMatchedTxn[1] == pair";
  local_1a8._8_8_ = (element_type *)0xe698b7;
  local_2f8[8] = 0;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abc70;
  stack0xfffffffffffffd20 = (lazy_ostream *)local_1a8;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_518 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_510 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_188,(lazy_ostream *)local_2f8,1,0,WARN,(check_type)pcVar36,
             (size_t)&local_518,0xcb);
  boost::detail::shared_count::~shared_count(&sStack_180.pn);
  local_528 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0xcd;
  file_09.m_begin = (iterator)&local_528;
  msg_09.m_end = pvVar14;
  msg_09.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_538,
             msg_09);
  local_2f8._0_8_ = _DAT_00e690f0;
  local_2f8[8] = UNK_00e690f8;
  local_2f8._9_7_ = _UNK_00e690f9;
  _local_2e8 = _DAT_00e69100;
  auVar28[0] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[0x10] == DAT_00e69100);
  auVar28[1] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[0x11] == DAT_00e69100._1_1_);
  auVar28[2] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[0x12] == DAT_00e69100._2_1_);
  auVar28[3] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[0x13] == DAT_00e69100._3_1_);
  auVar28[4] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[0x14] == DAT_00e69100._4_1_);
  auVar28[5] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[0x15] == DAT_00e69100._5_1_);
  auVar28[6] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[0x16] == DAT_00e69100._6_1_);
  auVar28[7] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[0x17] == DAT_00e69100._7_1_);
  auVar28[8] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[0x18] == DAT_00e69100._8_1_);
  auVar28[9] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[0x19] == DAT_00e69100._9_1_);
  auVar28[10] = -(((local_168.vMatchedTxn.
                    super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data
                  ._M_elems[0x1a] == DAT_00e69100._10_1_);
  auVar28[0xb] = -(((local_168.vMatchedTxn.
                     super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.
                   m_data._M_elems[0x1b] == DAT_00e69100._11_1_);
  auVar28[0xc] = -(((local_168.vMatchedTxn.
                     super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.
                   m_data._M_elems[0x1c] == DAT_00e69100._12_1_);
  auVar28[0xd] = -(((local_168.vMatchedTxn.
                     super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.
                   m_data._M_elems[0x1d] == DAT_00e69100._13_1_);
  auVar28[0xe] = -(((local_168.vMatchedTxn.
                     super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.
                   m_data._M_elems[0x1e] == DAT_00e69100._14_1_);
  auVar28[0xf] = -(((local_168.vMatchedTxn.
                     super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.
                   m_data._M_elems[0x1f] == DAT_00e69100._15_1_);
  auVar23[0] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[0] == DAT_00e690f0);
  auVar23[1] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[1] == DAT_00e690f0._1_1_);
  auVar23[2] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[2] == DAT_00e690f0._2_1_);
  auVar23[3] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[3] == DAT_00e690f0._3_1_);
  auVar23[4] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[4] == DAT_00e690f0._4_1_);
  auVar23[5] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[5] == DAT_00e690f0._5_1_);
  auVar23[6] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[6] == DAT_00e690f0._6_1_);
  auVar23[7] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[7] == DAT_00e690f0._7_1_);
  auVar23[8] = -((bool)((local_168.vMatchedTxn.
                         super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.
                       m_data._M_elems[8] == DAT_00e690f0._8_1_);
  auVar23[9] = -(((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data.
                 _M_elems[9] == DAT_00e690f0._9_1_);
  auVar23[10] = -(((local_168.vMatchedTxn.
                    super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data
                  ._M_elems[10] == DAT_00e690f0._10_1_);
  auVar23[0xb] = -(((local_168.vMatchedTxn.
                     super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.
                   m_data._M_elems[0xb] == DAT_00e690f0._11_1_);
  auVar23[0xc] = -(((local_168.vMatchedTxn.
                     super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.
                   m_data._M_elems[0xc] == DAT_00e690f0._12_1_);
  auVar23[0xd] = -(((local_168.vMatchedTxn.
                     super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.
                   m_data._M_elems[0xd] == DAT_00e690f0._13_1_);
  auVar23[0xe] = -(((local_168.vMatchedTxn.
                     super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.
                   m_data._M_elems[0xe] == DAT_00e690f0._14_1_);
  auVar23[0xf] = -(((local_168.vMatchedTxn.
                     super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.
                   m_data._M_elems[0xf] == DAT_00e690f0._15_1_);
  auVar23 = auVar23 & auVar28;
  local_1a8[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) == 0xffff);
  local_1a8._8_8_ = (element_type *)0x0;
  apuStack_198[0] = (undefined1 *)0x0;
  local_208 = (undefined1  [8])0xe698b8;
  local_200.px = (element_type *)0xe69928;
  sStack_180.px = (element_type *)(sStack_180._1_8_ << 8);
  local_188 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  sStack_180.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_548 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_540 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  uStack_170 = (assertion_result *)local_208;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a8,(lazy_ostream *)local_188,1,0,WARN,(check_type)pcVar36,
             (size_t)&local_548,0xcd);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)apuStack_198)->_M_allocated_capacity);
  local_558 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_550 = "";
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0xce;
  file_10.m_begin = (iterator)&local_558;
  msg_10.m_end = pvVar14;
  msg_10.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_568,
             msg_10);
  local_188[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((local_168.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first == 7);
  sStack_180.px = (element_type *)0x0;
  sStack_180.pn.pi_ = (sp_counted_base *)0x0;
  local_1a8._0_8_ = "merkleBlock.vMatchedTxn[0].first == 7";
  local_1a8._8_8_ = (element_type *)0xe6994e;
  local_2f8[8] = 0;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abc70;
  stack0xfffffffffffffd20 = (lazy_ostream *)local_1a8;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_578 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_570 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_188,(lazy_ostream *)local_2f8,1,0,WARN,(check_type)pcVar36,
             (size_t)&local_578,0xce);
  boost::detail::shared_count::~shared_count(&sStack_180.pn);
  local_588 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0xd0;
  file_11.m_begin = (iterator)&local_588;
  msg_11.m_end = pvVar14;
  msg_11.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_598,
             msg_11);
  CPartialMerkleTree::ExtractMatches
            ((uint256 *)local_2f8,&local_168.txn,
             (vector<uint256,_std::allocator<uint256>_> *)local_1c8,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1e8);
  auVar29[0] = -((class_property<bool>)
                 local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0]
                == local_2f8[0]);
  auVar29[1] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1]
                == local_2f8[1]);
  auVar29[2] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2]
                == local_2f8[2]);
  auVar29[3] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3]
                == local_2f8[3]);
  auVar29[4] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4]
                == local_2f8[4]);
  auVar29[5] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5]
                == local_2f8[5]);
  auVar29[6] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6]
                == local_2f8[6]);
  auVar29[7] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7]
                == local_2f8[7]);
  auVar29[8] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8]
                == local_2f8[8]);
  auVar29[9] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9]
                == local_2f8[9]);
  auVar29[10] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [10] == local_2f8[10]);
  auVar29[0xb] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0xb] == local_2f8[0xb]);
  auVar29[0xc] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0xc] == local_2f8[0xc]);
  auVar29[0xd] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0xd] == local_2f8[0xd]);
  auVar29[0xe] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0xe] == local_2f8[0xe]);
  auVar29[0xf] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0xf] == local_2f8[0xf]);
  auVar34[0] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                 [0x10] == local_2e8[0]);
  auVar34[1] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                 [0x11] == local_2e8[1]);
  auVar34[2] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                 [0x12] == local_2e8[2]);
  auVar34[3] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                 [0x13] == local_2e8[3]);
  auVar34[4] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                 [0x14] == local_2e8[4]);
  auVar34[5] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                 [0x15] == local_2e8[5]);
  auVar34[6] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                 [0x16] == local_2e8[6]);
  auVar34[7] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                 [0x17] == local_2e8[7]);
  auVar34[8] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                 [0x18] == local_2e8[8]);
  auVar34[9] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                 [0x19] == uStack_2df);
  auVar34[10] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x1a] == uStack_2de);
  auVar34[0xb] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0x1b] == uStack_2dd);
  auVar34[0xc] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0x1c] == uStack_2dc);
  auVar34[0xd] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0x1d] == uStack_2db);
  auVar34[0xe] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0x1e] == uStack_2da);
  auVar34[0xf] = -(local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0x1f] == uStack_2d9);
  auVar29 = auVar29 & auVar34;
  local_1a8[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar29[0xf] >> 7) << 0xf) == 0xffff);
  local_1a8._8_8_ = (element_type *)0x0;
  apuStack_198[0] = (undefined1 *)0x0;
  local_208 = (undefined1  [8])0xe69795;
  local_200.px = (element_type *)0xe697dd;
  sStack_180.px = (element_type *)(sStack_180._1_8_ << 8);
  local_188 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  sStack_180.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_5a0 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  uStack_170 = (assertion_result *)local_208;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a8,(lazy_ostream *)local_188,1,0,WARN,(check_type)pcVar36,
             (size_t)&local_5a8,0xd0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)apuStack_198)->_M_allocated_capacity);
  local_5b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_5b0 = "";
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0xd1;
  file_12.m_begin = (iterator)&local_5b8;
  msg_12.m_end = pvVar14;
  msg_12.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_5c8,
             msg_12);
  local_188[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((long)(local_1c8._8_8_ - local_1c8._0_8_) >> 5 ==
                 ((long)local_168.vMatchedTxn.
                        super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_168.vMatchedTxn.
                        super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x71c71c71c71c71c7);
  sStack_180.px = (element_type *)0x0;
  sStack_180.pn.pi_ = (sp_counted_base *)0x0;
  local_1a8._0_8_ = "vMatched.size() == merkleBlock.vMatchedTxn.size()";
  local_1a8._8_8_ = (element_type *)0xe6980f;
  local_2f8[8] = 0;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abc70;
  stack0xfffffffffffffd20 = (lazy_ostream *)local_1a8;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_5d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_5d0 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_188,(lazy_ostream *)local_2f8,1,0,WARN,(check_type)pcVar36,
             (size_t)&local_5d8,0xd1);
  boost::detail::shared_count::~shared_count(&sStack_180.pn);
  if (local_1c8._8_8_ != local_1c8._0_8_) {
    uVar16 = 1;
    uVar15 = 0;
    do {
      local_5e8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
      ;
      local_5e0 = "";
      local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_13.m_end = (iterator)0xd3;
      file_13.m_begin = (iterator)&local_5e8;
      msg_13.m_end = pvVar14;
      msg_13.m_begin = pvVar13;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_5f8,
                 msg_13);
      puVar1 = (pointer)(local_1c8._0_8_ + uVar15 * 0x20);
      auVar20 = *(undefined1 (*) [16])
                 ((((pointer)(local_1c8._0_8_ + uVar15 * 0x20))->super_base_blob<256U>).m_data.
                  _M_elems + 0x10);
      puVar2 = &local_168.vMatchedTxn.
                super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar15].second;
      auVar35[0] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[0]);
      auVar35[1] = -((puVar2->super_base_blob<256U>).m_data._M_elems[1] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[1]);
      auVar35[2] = -((puVar2->super_base_blob<256U>).m_data._M_elems[2] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[2]);
      auVar35[3] = -((puVar2->super_base_blob<256U>).m_data._M_elems[3] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[3]);
      auVar35[4] = -((puVar2->super_base_blob<256U>).m_data._M_elems[4] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[4]);
      auVar35[5] = -((puVar2->super_base_blob<256U>).m_data._M_elems[5] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[5]);
      auVar35[6] = -((puVar2->super_base_blob<256U>).m_data._M_elems[6] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[6]);
      auVar35[7] = -((puVar2->super_base_blob<256U>).m_data._M_elems[7] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[7]);
      auVar35[8] = -((puVar2->super_base_blob<256U>).m_data._M_elems[8] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[8]);
      auVar35[9] = -((puVar2->super_base_blob<256U>).m_data._M_elems[9] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[9]);
      auVar35[10] = -((puVar2->super_base_blob<256U>).m_data._M_elems[10] ==
                     (puVar1->super_base_blob<256U>).m_data._M_elems[10]);
      auVar35[0xb] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xb] ==
                      (puVar1->super_base_blob<256U>).m_data._M_elems[0xb]);
      auVar35[0xc] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xc] ==
                      (puVar1->super_base_blob<256U>).m_data._M_elems[0xc]);
      auVar35[0xd] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xd] ==
                      (puVar1->super_base_blob<256U>).m_data._M_elems[0xd]);
      auVar35[0xe] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xe] ==
                      (puVar1->super_base_blob<256U>).m_data._M_elems[0xe]);
      auVar35[0xf] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xf] ==
                      (puVar1->super_base_blob<256U>).m_data._M_elems[0xf]);
      puVar3 = local_168.vMatchedTxn.
               super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15].second.super_base_blob<256U>.m_data
               ._M_elems + 0x10;
      auVar24[0] = -(*puVar3 == auVar20[0]);
      auVar24[1] = -(puVar3[1] == auVar20[1]);
      auVar24[2] = -(puVar3[2] == auVar20[2]);
      auVar24[3] = -(puVar3[3] == auVar20[3]);
      auVar24[4] = -(puVar3[4] == auVar20[4]);
      auVar24[5] = -(puVar3[5] == auVar20[5]);
      auVar24[6] = -(puVar3[6] == auVar20[6]);
      auVar24[7] = -(puVar3[7] == auVar20[7]);
      auVar24[8] = -(puVar3[8] == auVar20[8]);
      auVar24[9] = -(puVar3[9] == auVar20[9]);
      auVar24[10] = -(puVar3[10] == auVar20[10]);
      auVar24[0xb] = -(puVar3[0xb] == auVar20[0xb]);
      auVar24[0xc] = -(puVar3[0xc] == auVar20[0xc]);
      auVar24[0xd] = -(puVar3[0xd] == auVar20[0xd]);
      auVar24[0xe] = -(puVar3[0xe] == auVar20[0xe]);
      auVar24[0xf] = -(puVar3[0xf] == auVar20[0xf]);
      auVar24 = auVar24 & auVar35;
      local_188[0] = (class_property<bool>)
                     (class_property<bool>)
                     ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) == 0xffff);
      sStack_180.px = (element_type *)0x0;
      sStack_180.pn.pi_ = (sp_counted_base *)0x0;
      local_1a8._0_8_ = "vMatched[i] == merkleBlock.vMatchedTxn[i].second";
      local_1a8._8_8_ = (element_type *)0xe69840;
      local_2f8[8] = 0;
      local_2f8._0_8_ = &PTR__lazy_ostream_013abc70;
      stack0xfffffffffffffd20 = (lazy_ostream *)local_1a8;
      local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
      local_608 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
      ;
      local_600 = "";
      pvVar13 = (iterator)0x1;
      pvVar14 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_188,(lazy_ostream *)local_2f8,1,0,WARN,
                 (check_type)pcVar36,(size_t)&local_608,0xd3);
      boost::detail::shared_count::~shared_count(&sStack_180.pn);
      uVar15 = (ulong)uVar16;
      uVar16 = uVar16 + 1;
    } while (uVar15 < (ulong)((long)(local_1c8._8_8_ - local_1c8._0_8_) >> 5));
  }
  if (local_1e8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    local_1e8.field_2._M_allocated_capacity - (long)local_1e8._M_dataplus._M_p);
  }
  if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1c8._0_8_,(long)local_1b8 - local_1c8._0_8_);
  }
  if (local_168.vMatchedTxn.
      super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.vMatchedTxn.
                    super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.vMatchedTxn.
                          super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.vMatchedTxn.
                          super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_168.txn.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.txn.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.txn.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.txn.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_168.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_168.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_168.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_168.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_168.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_168.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._8_8_ =
         local_168.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    local_168.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_168.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._8_8_ =
         local_168.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    local_168.txn.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_320.vData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_320.vData.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_320.vData.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_320.vData.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_a8.vtx);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(merkle_block_1)
{
    CBlock block = getBlock13b8a();
    CBloomFilter filter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    // Match the last transaction
    filter.insert(uint256{"74d681e0e03bafa802c8aa084379aa98d9fcd632ddc2ed9782b586ec87451f20"});

    CMerkleBlock merkleBlock(block, filter);
    BOOST_CHECK_EQUAL(merkleBlock.header.GetHash().GetHex(), block.GetHash().GetHex());

    BOOST_CHECK_EQUAL(merkleBlock.vMatchedTxn.size(), 1U);
    std::pair<unsigned int, uint256> pair = merkleBlock.vMatchedTxn[0];

    BOOST_CHECK(merkleBlock.vMatchedTxn[0].second == uint256{"74d681e0e03bafa802c8aa084379aa98d9fcd632ddc2ed9782b586ec87451f20"});
    BOOST_CHECK(merkleBlock.vMatchedTxn[0].first == 8);

    std::vector<uint256> vMatched;
    std::vector<unsigned int> vIndex;
    BOOST_CHECK(merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot);
    BOOST_CHECK(vMatched.size() == merkleBlock.vMatchedTxn.size());
    for (unsigned int i = 0; i < vMatched.size(); i++)
        BOOST_CHECK(vMatched[i] == merkleBlock.vMatchedTxn[i].second);

    // Also match the 8th transaction
    filter.insert(uint256{"dd1fd2a6fc16404faf339881a90adbde7f4f728691ac62e8f168809cdfae1053"});
    merkleBlock = CMerkleBlock(block, filter);
    BOOST_CHECK(merkleBlock.header.GetHash() == block.GetHash());

    BOOST_CHECK(merkleBlock.vMatchedTxn.size() == 2);

    BOOST_CHECK(merkleBlock.vMatchedTxn[1] == pair);

    BOOST_CHECK(merkleBlock.vMatchedTxn[0].second == uint256{"dd1fd2a6fc16404faf339881a90adbde7f4f728691ac62e8f168809cdfae1053"});
    BOOST_CHECK(merkleBlock.vMatchedTxn[0].first == 7);

    BOOST_CHECK(merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot);
    BOOST_CHECK(vMatched.size() == merkleBlock.vMatchedTxn.size());
    for (unsigned int i = 0; i < vMatched.size(); i++)
        BOOST_CHECK(vMatched[i] == merkleBlock.vMatchedTxn[i].second);
}